

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc>::
emplace<QOpenGLProgramBinaryCache::ShaderDesc>
          (QGenericArrayOps<QOpenGLProgramBinaryCache::ShaderDesc> *this,qsizetype i,
          ShaderDesc *args)

{
  ShaderDesc **ppSVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_a8;
  undefined1 *local_58;
  QArrayDataPointer<char> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size == i) {
      qVar4 = QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>);
      if (qVar4 == 0) goto LAB_004f11e5;
      QOpenGLProgramBinaryCache::ShaderDesc::ShaderDesc
                ((this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr +
                 (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size,args);
LAB_004f1301:
      pqVar2 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_004f12bb;
    }
LAB_004f11e5:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>);
      if (qVar4 != 0) {
        QOpenGLProgramBinaryCache::ShaderDesc::ShaderDesc
                  ((this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr + -1,
                   args);
        ppSVar1 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
        *ppSVar1 = *ppSVar1 + -1;
        goto LAB_004f1301;
      }
    }
  }
  QStack_50.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QOpenGLProgramBinaryCache::ShaderDesc::ShaderDesc((ShaderDesc *)&local_58,args);
  bVar5 = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size != 0;
  QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>::detachAndGrow
            (&this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>,
             (uint)(i == 0 && bVar5),1,(ShaderDesc **)0x0,
             (QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc> *)0x0);
  if (i == 0 && bVar5) {
    QOpenGLProgramBinaryCache::ShaderDesc::ShaderDesc
              ((this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr + -1,
               (ShaderDesc *)&local_58);
    ppSVar1 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
    *ppSVar1 = *ppSVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_a8.sourceCopyConstruct = 0;
    local_a8.nSource = 0;
    local_a8.move = 0;
    local_a8.sourceCopyAssign = 0;
    local_a8.end = (ShaderDesc *)0x0;
    local_a8.last = (ShaderDesc *)0x0;
    local_a8.where = (ShaderDesc *)0x0;
    local_a8.begin = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).ptr;
    local_a8.size = (this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>).size;
    local_a8.data = &this->super_QArrayDataPointer<QOpenGLProgramBinaryCache::ShaderDesc>;
    Inserter::insertOne(&local_a8,i,(ShaderDesc *)&local_58);
    (local_a8.data)->ptr = local_a8.begin;
    (local_a8.data)->size = local_a8.size;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_50);
LAB_004f12bb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }